

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5RollbackToMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  char *pcVar1;
  _func_int_sqlite3_vtab_cursor_ptr *p_Var2;
  
  for (p_Var2 = (pVtab[2].pModule)->xNext; p_Var2 != (_func_int_sqlite3_vtab_cursor_ptr *)0x0;
      p_Var2 = *(_func_int_sqlite3_vtab_cursor_ptr **)(p_Var2 + 8)) {
    if ((*(int *)(p_Var2 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var2 == pVtab)) {
      p_Var2[0x50] = (_func_int_sqlite3_vtab_cursor_ptr)((byte)p_Var2[0x50] | 0x20);
    }
  }
  pcVar1 = pVtab[1].zErrMsg;
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  sqlite3Fts5IndexRollback(*(Fts5Index **)(pcVar1 + 8));
  return 0;
}

Assistant:

static int fts5RollbackToMethod(sqlite3_vtab *pVtab, int iSavepoint){
  Fts5FullTable *pTab = (Fts5FullTable*)pVtab;
  UNUSED_PARAM(iSavepoint);  /* Call below is a no-op for NDEBUG builds */
  fts5CheckTransactionState(pTab, FTS5_ROLLBACKTO, iSavepoint);
  fts5TripCursors(pTab);
  return sqlite3Fts5StorageRollback(pTab->pStorage);
}